

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

deBool qpXmlWriter_endElement(qpXmlWriter *writer,char *elementName)

{
  char *elementName_local;
  qpXmlWriter *writer_local;
  
  writer->xmlElementDepth = writer->xmlElementDepth + -1;
  if (writer->xmlPrevIsStartElement == 0) {
    fprintf((FILE *)writer->outputFile,"</%s>\n",elementName);
  }
  else {
    fprintf((FILE *)writer->outputFile," />\n");
    writer->xmlPrevIsStartElement = 0;
  }
  return 1;
}

Assistant:

deBool qpXmlWriter_endElement (qpXmlWriter* writer, const char* elementName)
{
	DE_ASSERT(writer && writer->xmlElementDepth > 0);
	writer->xmlElementDepth--;

	if (writer->xmlPrevIsStartElement) /* leave flag as-is */
	{
		fprintf(writer->outputFile, " />\n");
		writer->xmlPrevIsStartElement = DE_FALSE;
	}
	else
		fprintf(writer->outputFile, "</%s>\n", /*getIndentStr(writer->xmlElementDepth),*/ elementName);

	return DE_TRUE;
}